

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O2

ON_RenderContent * __thiscall ON_RenderContentPrivate::FindLastChild(ON_RenderContentPrivate *this)

{
  ON_RenderContent *pOVar1;
  ON_RenderContent *pOVar2;
  ON_RenderContent **ppOVar3;
  
  ppOVar3 = &this->m_first_child;
  pOVar2 = (ON_RenderContent *)0x0;
  while (pOVar1 = *ppOVar3, pOVar1 != (ON_RenderContent *)0x0) {
    pOVar2 = pOVar1;
    ppOVar3 = &pOVar1->_private->m_next_sibling;
  }
  return pOVar2;
}

Assistant:

ON_RenderContent* ON_RenderContentPrivate::FindLastChild(void) const
{
  ON_RenderContent* result = nullptr;

  ON_RenderContent* candidate = m_first_child;
  while (nullptr != candidate)
  {
    result = candidate;
    candidate = candidate->_private->m_next_sibling;
  }

  return result;
}